

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O3

void __thiscall
soplex::SPxLPBase<double>::doAddCols(SPxLPBase<double> *this,LPColSetBase<double> *set,bool scale)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pointer pdVar4;
  Item *pIVar5;
  bool bVar6;
  double *pdVar7;
  Nonzero<double> *pNVar8;
  long lVar9;
  double dVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  Nonzero<double> *pNVar14;
  int iVar15;
  long lVar16;
  Item *pIVar17;
  DataArray<int> local_b0;
  LPColSetBase<double> *local_98;
  undefined8 uStack_90;
  double local_88;
  undefined8 uStack_80;
  DataKey local_70;
  LPRowBase<double> local_68;
  
  iVar1 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  lVar11 = (long)iVar1;
  iVar2 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
  local_b0.data = (int *)0x0;
  local_b0.memFactor = 1.2;
  local_b0.thesize = 0;
  if (0 < iVar2) {
    local_b0.thesize = iVar2;
  }
  local_b0.themax = 1;
  if (0 < iVar2) {
    local_b0.themax = local_b0.thesize;
  }
  spx_alloc<int*>(&local_b0.data,local_b0.themax);
  if (&this->super_LPColSetBase<double> != set) {
    LPColSetBase<double>::add(&this->super_LPColSetBase<double>,set);
  }
  lVar9 = (long)(this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
  if (0 < lVar9) {
    memset(local_b0.data,0,lVar9 << 2);
  }
  dVar10 = (double)(long)(set->super_SVSetBase<double>).set.thenum;
  if (0 < (long)dVar10) {
    local_98 = set;
    do {
      pIVar17 = (local_98->super_SVSetBase<double>).set.theitem;
      iVar15 = (local_98->super_SVSetBase<double>).set.thekey[(long)dVar10 - 1].idx;
      lVar9 = (long)pIVar17[iVar15].data.super_SVectorBase<double>.memused;
      local_88 = dVar10;
      if (0 < lVar9) {
        do {
          iVar3 = pIVar17[iVar15].data.super_SVectorBase<double>.m_elem[lVar9 + -1].idx;
          if ((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum <= iVar3) {
            LPRowBase<double>::LPRowBase(&local_68,0);
            DataArray<int>::reSize(&local_b0,iVar3 + 1);
            iVar12 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
            lVar16 = (long)iVar12;
            if (iVar12 <= iVar3) {
              iVar12 = (iVar3 - iVar12) + 1;
              do {
                local_b0.data[lVar16] = 0;
                local_70.info = 0;
                local_70.idx = -1;
                LPRowSetBase<double>::add(&this->super_LPRowSetBase<double>,&local_70,&local_68);
                lVar16 = lVar16 + 1;
                iVar12 = iVar12 + -1;
              } while (iVar12 != 0);
            }
            local_68.vec._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_003ae9c8;
            if (local_68.vec.theelem != (Nonzero<double> *)0x0) {
              free(local_68.vec.theelem);
            }
          }
          local_b0.data[iVar3] = local_b0.data[iVar3] + 1;
          bVar6 = 1 < lVar9;
          lVar9 = lVar9 + -1;
        } while (bVar6);
      }
      dVar10 = (double)((long)local_88 - 1);
    } while (1 < (long)local_88);
  }
  iVar15 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
  if (0 < iVar15) {
    lVar9 = 0;
    do {
      if (0 < local_b0.data[lVar9]) {
        pIVar17 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
                  (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[lVar9].idx;
        iVar15 = local_b0.data[lVar9] + (pIVar17->data).super_SVectorBase<double>.memused;
        SVSetBase<double>::xtend((SVSetBase<double> *)this,(SVectorBase<double> *)pIVar17,iVar15);
        (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem
        [(this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[lVar9].idx].data.
        super_SVectorBase<double>.memused = iVar15;
        iVar15 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < iVar15);
  }
  iVar15 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  if (iVar1 < iVar15) {
    pdVar7 = (double *)__tls_get_addr(&PTR_003b4b70);
    local_88 = *pdVar7;
    uStack_80 = 0;
    local_98 = (LPColSetBase<double> *)((ulong)local_88 ^ 0x8000000000000000);
    uStack_90 = 0x8000000000000000;
    do {
      if (this->thesense != MAXIMIZE) {
        pdVar4 = (this->super_LPColSetBase<double>).object.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        pdVar4[lVar11] = -pdVar4[lVar11];
      }
      pIVar17 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem +
                (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[lVar11].idx;
      iVar15 = 0;
      if (scale) {
        iVar15 = (*this->lp_scaler->_vptr_SPxScaler[1])
                           (this->lp_scaler,pIVar17,&(this->super_LPRowSetBase<double>).scaleExp);
        dVar10 = (this->super_LPColSetBase<double>).up.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar11];
        ::soplex::infinity::__tls_init();
        if (dVar10 < local_88) {
          dVar10 = ldexp((this->super_LPColSetBase<double>).up.val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar11],-iVar15);
          (this->super_LPColSetBase<double>).up.val.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar11] = dVar10;
        }
        dVar10 = (this->super_LPColSetBase<double>).low.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar11];
        ::soplex::infinity::__tls_init();
        if ((double)local_98 < dVar10) {
          dVar10 = ldexp((this->super_LPColSetBase<double>).low.val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar11],-iVar15);
          (this->super_LPColSetBase<double>).low.val.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar11] = dVar10;
        }
        dVar10 = ldexp((this->super_LPColSetBase<double>).object.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar11],iVar15);
        (this->super_LPColSetBase<double>).object.val.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [lVar11] = dVar10;
        (this->super_LPColSetBase<double>).scaleExp.data[lVar11] = iVar15;
      }
      lVar9 = (long)(pIVar17->data).super_SVectorBase<double>.memused;
      if (0 < lVar9) {
        pNVar8 = (pIVar17->data).super_SVectorBase<double>.m_elem;
        uVar13 = lVar9 + 1;
        lVar9 = lVar9 << 4;
        do {
          iVar3 = *(int *)((long)pNVar8 + lVar9 + -8);
          pIVar5 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem;
          iVar12 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[iVar3].idx;
          lVar16 = (long)pIVar5[iVar12].data.super_SVectorBase<double>.memused -
                   (long)local_b0.data[iVar3];
          local_b0.data[iVar3] = local_b0.data[iVar3] + -1;
          pNVar14 = pIVar5[iVar12].data.super_SVectorBase<double>.m_elem;
          pNVar14[lVar16].idx = (int)lVar11;
          dVar10 = *(double *)((long)&pNVar8[-1].val + lVar9);
          if (scale) {
            dVar10 = ldexp(dVar10,(this->super_LPRowSetBase<double>).scaleExp.data[iVar3] + iVar15);
            pNVar8 = (pIVar17->data).super_SVectorBase<double>.m_elem;
            *(double *)((long)&pNVar8[-1].val + lVar9) = dVar10;
            pNVar14 = pIVar5[iVar12].data.super_SVectorBase<double>.m_elem;
          }
          pNVar14[lVar16].val = dVar10;
          uVar13 = uVar13 - 1;
          lVar9 = lVar9 + -0x10;
        } while (1 < uVar13);
      }
      lVar11 = lVar11 + 1;
      iVar15 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
    } while (lVar11 < iVar15);
  }
  (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x51])
            (this,(ulong)(uint)(iVar15 - iVar1));
  (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x50])
            (this,(ulong)(uint)((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.
                                thenum - iVar2));
  if (local_b0.data != (int *)0x0) {
    free(local_b0.data);
  }
  return;
}

Assistant:

void doAddCols(const LPColSetBase<R>& set, bool scale = false)
   {
      int i, j;
      int oldColNumber = nCols();
      int oldRowNumber = nRows();
      DataArray < int > newRows(nRows());

      if(&set != this)
         LPColSetBase<R>::add(set);

      assert(LPColSetBase<R>::isConsistent());
      assert(LPRowSetBase<R>::isConsistent());

      // count additional nonzeros per row
      for(i = nRows() - 1; i >= 0; --i)
         newRows[i] = 0;

      for(i = set.num() - 1; i >= 0; --i)
      {
         const SVectorBase<R>& vec = set.colVector(i);

         for(j = vec.size() - 1; j >= 0; --j)
         {
            // create new rows if required
            int l = vec.index(j);

            if(l >= nRows())
            {
               LPRowBase<R> empty;
               newRows.reSize(l + 1);

               for(int k = nRows(); k <= l; ++k)
               {
                  newRows[k] = 0;
                  LPRowSetBase<R>::add(empty);
               }

            }

            assert(l < nRows());
            newRows[l]++;
         }
      }

      // extend rows as required
      for(i = 0; i < nRows(); ++i)
      {
         if(newRows[i] > 0)
         {
            int len = newRows[i] + rowVector(i).size();
            LPRowSetBase<R>::xtend(i, len);
            rowVector_w(i).set_size(len);
         }
      }

      // insert new elements to row file
      for(i = oldColNumber; i < nCols(); ++i)
      {
         // @todo: Is there a better way to write the following if, else?
         if(thesense == MAXIMIZE)
         {
            LPColSetBase<R>::maxObj_w(i) *= 1;
         }
         else                  // thesense is MINIMIZE = -1
         {
            LPColSetBase<R>::maxObj_w(i) *= -1;
         }

         SVectorBase<R>& vec = colVector_w(i);
         int newColScaleExp = 0;

         DataArray <int>& rowscaleExp = LPRowSetBase<R>::scaleExp;

         // compute new column scaling factor and apply it to the bounds
         if(scale)
         {
            newColScaleExp = lp_scaler->computeScaleExp(vec, rowscaleExp);

            if(upper(i) < R(infinity))
               upper_w(i) = spxLdexp(upper_w(i), - newColScaleExp);

            if(lower(i) > R(-infinity))
               lower_w(i) = spxLdexp(lower_w(i), - newColScaleExp);

            maxObj_w(i) = spxLdexp(maxObj_w(i), newColScaleExp);

            LPColSetBase<R>::scaleExp[i] = newColScaleExp;
         }

         for(j = vec.size() - 1; j >= 0; --j)
         {
            int k = vec.index(j);
            SVectorBase<R>& row = rowVector_w(k);
            int idx = row.size() - newRows[k];
            assert(newRows[k] > 0);
            newRows[k]--;
            row.index(idx) = i;

            // apply new column and existing row scaling factors to both ColSet and RowSet
            if(scale)
               vec.value(j) = spxLdexp(vec.value(j), newColScaleExp + rowscaleExp[k]);

            row.value(idx) = vec.value(j);
         }
      }

#ifndef NDEBUG

      for(i = 0; i < nRows(); ++i)
         assert(newRows[i] == 0);

#endif

      assert(SPxLPBase<R>::isConsistent());

      assert(set.num() == nCols() - oldColNumber);
      addedCols(nCols() - oldColNumber);
      addedRows(nRows() - oldRowNumber);
   }